

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * Catch::fpToString<double>(string *__return_storage_ptr__,double value,int precision)

{
  long lVar1;
  size_type sVar2;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (NAN(value)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"nan",(allocator<char> *)&local_38);
  }
  else {
    ReusableStringStream::ReusableStringStream(&rss);
    lVar1 = *(long *)rss.m_oss;
    *(long *)(rss.m_oss + *(long *)(lVar1 + -0x18) + 8) = (long)precision;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(rss.m_oss + lVar1 + 0x18) = *(uint *)(rss.m_oss + lVar1 + 0x18) & 0xfffffefb | 4;
    std::ostream::_M_insert<double>(value);
    std::__cxx11::stringbuf::str();
    sVar2 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(__return_storage_ptr__,'0',0xffffffffffffffff);
    if ((sVar2 != 0xffffffffffffffff) && (sVar2 != __return_storage_ptr__->_M_string_length - 1)) {
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_38,__return_storage_ptr__,0,
                 sVar2 + ((__return_storage_ptr__->_M_dataplus)._M_p[sVar2] == '.') + 1);
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(__return_storage_ptr__,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    ReusableStringStream::~ReusableStringStream(&rss);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString(T value, int precision) {
    if (Catch::isnan(value)) {
      return "nan";
    }

    ReusableStringStream rss;
    rss << std::setprecision(precision) << std::fixed << value;
    std::string d = rss.str();
    std::size_t i = d.find_last_not_of('0');
    if (i != std::string::npos && i != d.size() - 1) {
      if (d[i] == '.')
        i++;
      d = d.substr(0, i + 1);
    }
    return d;
  }